

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3EvalDlPhraseNext(Fts3Table *pTab,Fts3Doclist *pDL,u8 *pbEof)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  sqlite3_int64 iDelta;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar3 = (byte *)pDL->aAll;
  pbVar6 = (byte *)pDL->pNextDocid;
  if ((((byte *)pDL->pNextDocid == (byte *)0x0) && (pbVar6 = pbVar3, pbVar3 == (byte *)0x0)) ||
     (iVar2 = pDL->nAll, pbVar3 + iVar2 <= pbVar6)) {
    *pbEof = '\x01';
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    iVar4 = sqlite3Fts3GetVarintU((char *)pbVar6,(sqlite_uint64 *)&local_38);
    pbVar6 = pbVar6 + iVar4;
    if ((pTab->bDescIdx == '\0') || (pDL->pNextDocid == (char *)0x0)) {
      pDL->iDocid = (sqlite3_int64)(local_38 + pDL->iDocid);
    }
    else {
      pDL->iDocid = pDL->iDocid - (long)local_38;
    }
    pDL->pList = (char *)pbVar6;
    bVar7 = *pbVar6;
    pbVar5 = pbVar6;
    if (bVar7 != 0) {
      do {
        pbVar1 = pbVar5 + 1;
        pbVar5 = pbVar5 + 1;
        bVar8 = bVar7 & 0x80;
        bVar7 = *pbVar1;
      } while (bVar8 != 0 || *pbVar1 != 0);
    }
    pbVar5 = pbVar5 + 1;
    pDL->nList = (int)pbVar5 - (int)pbVar6;
    for (; (pbVar5 < pbVar3 + iVar2 && (*pbVar5 == 0)); pbVar5 = pbVar5 + 1) {
    }
    pDL->pNextDocid = (char *)pbVar5;
    *pbEof = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3EvalDlPhraseNext(
  Fts3Table *pTab,
  Fts3Doclist *pDL,
  u8 *pbEof
){
  char *pIter;                            /* Used to iterate through aAll */
  char *pEnd;                             /* 1 byte past end of aAll */

  if( pDL->pNextDocid ){
    pIter = pDL->pNextDocid;
    assert( pDL->aAll!=0 || pIter==0 );
  }else{
    pIter = pDL->aAll;
  }

  if( pIter==0 || pIter>=(pEnd = pDL->aAll + pDL->nAll) ){
    /* We have already reached the end of this doclist. EOF. */
    *pbEof = 1;
  }else{
    sqlite3_int64 iDelta;
    pIter += sqlite3Fts3GetVarint(pIter, &iDelta);
    if( pTab->bDescIdx==0 || pDL->pNextDocid==0 ){
      pDL->iDocid += iDelta;
    }else{
      pDL->iDocid -= iDelta;
    }
    pDL->pList = pIter;
    fts3PoslistCopy(0, &pIter);
    pDL->nList = (int)(pIter - pDL->pList);

    /* pIter now points just past the 0x00 that terminates the position-
    ** list for document pDL->iDocid. However, if this position-list was
    ** edited in place by fts3EvalNearTrim(), then pIter may not actually
    ** point to the start of the next docid value. The following line deals
    ** with this case by advancing pIter past the zero-padding added by
    ** fts3EvalNearTrim().  */
    while( pIter<pEnd && *pIter==0 ) pIter++;

    pDL->pNextDocid = pIter;
    assert( pIter>=&pDL->aAll[pDL->nAll] || *pIter );
    *pbEof = 0;
  }
}